

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzprinteg.h
# Opt level: O2

void __thiscall TPZPrInteg<TPZInt1d>::SetOrder(TPZPrInteg<TPZInt1d> *this,TPZVec<int> *ord,int type)

{
  int order;
  TPZGaussRule *pTVar1;
  
  if (ord->fNElements < 2) {
    std::operator<<((ostream *)&std::cout,
                    "TPZPrInteg::SetOrder: number of integration points specified smaller than dimension\n"
                   );
    return;
  }
  TPZInt1d::SetOrder(&this->super_TPZInt1d,ord,type);
  order = ord->fStore[1];
  this->fOrdKsi = order;
  pTVar1 = TPZIntRuleList::GetRule(&TPZIntRuleList::gIntRuleList,order,0);
  this->fIntP = pTVar1;
  return;
}

Assistant:

void SetOrder(TPZVec<int> &ord, int type = 0) override
    {
#ifndef PZNODEBUG
		if(ord.NElements() < Dim) {
			std::cout << "TPZPrInteg::SetOrder: number of integration points specified smaller than dimension\n";
			return;
		}
#endif
		TFather::SetOrder(ord,type);
		fOrdKsi = ord[Dim-1];
		fIntP   = TPZIntRuleList::gIntRuleList.GetRule(ord[Dim-1]);
    }